

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

FILE * tplt_open(lemon *lemp)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  char *__filename;
  char *pcVar4;
  char buf [1000];
  char acStack_408 [1000];
  
  __filename = acStack_408;
  if (user_templatename != (char *)0x0) {
    iVar1 = access(user_templatename,4);
    if (iVar1 == -1) {
      tplt_open_cold_2();
      return (FILE *)0x0;
    }
    pFVar2 = fopen(user_templatename,"rb");
    if (pFVar2 == (FILE *)0x0) {
      tplt_open_cold_1();
      return (FILE *)0x0;
    }
    return (FILE *)pFVar2;
  }
  pcVar4 = lemp->filename;
  pcVar3 = strrchr(pcVar4,0x2e);
  if (pcVar3 == (char *)0x0) {
    lemon_sprintf(acStack_408,"%s.lt",pcVar4);
  }
  else {
    lemon_sprintf(acStack_408,"%.*s.lt",(ulong)(uint)((int)pcVar3 - (int)pcVar4),pcVar4);
  }
  iVar1 = access(acStack_408,4);
  if (iVar1 != 0) {
    __filename = tplt_open::templatename;
    iVar1 = access(tplt_open::templatename,4);
    if (iVar1 != 0) {
      __filename = pathsearch(lemp->argv0,tplt_open::templatename,0);
      pcVar4 = __filename;
      goto LAB_0010ab09;
    }
  }
  pcVar4 = (char *)0x0;
LAB_0010ab09:
  if (__filename == (char *)0x0) {
    tplt_open_cold_4();
    return (FILE *)0x0;
  }
  pFVar2 = fopen(__filename,"rb");
  if (pFVar2 == (FILE *)0x0) {
    tplt_open_cold_3();
  }
  free(pcVar4);
  return (FILE *)pFVar2;
}

Assistant:

PRIVATE FILE *tplt_open(struct lemon *lemp)
{
  static char templatename[] = "lempar.c";
  char buf[1000];
  FILE *in;
  char *tpltname;
  char *toFree = 0;
  char *cp;

  /* first, see if user specified a template filename on the command line. */
  if (user_templatename != 0) {
    if( access(user_templatename,004)==-1 ){
      fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
        user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    in = fopen(user_templatename,"rb");
    if( in==0 ){
      fprintf(stderr,"Can't open the template file \"%s\".\n",
              user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    return in;
  }

  cp = strrchr(lemp->filename,'.');
  if( cp ){
    lemon_sprintf(buf,"%.*s.lt",(int)(cp-lemp->filename),lemp->filename);
  }else{
    lemon_sprintf(buf,"%s.lt",lemp->filename);
  }
  if( access(buf,004)==0 ){
    tpltname = buf;
  }else if( access(templatename,004)==0 ){
    tpltname = templatename;
  }else{
    toFree = tpltname = pathsearch(lemp->argv0,templatename,0);
  }
  if( tpltname==0 ){
    fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
    templatename);
    lemp->errorcnt++;
    return 0;
  }
  in = fopen(tpltname,"rb");
  if( in==0 ){
    fprintf(stderr,"Can't open the template file \"%s\".\n",tpltname);
    lemp->errorcnt++;
  }
  free(toFree);
  return in;
}